

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O3

void libcmepoll_LTX_write_select
               (CMtrans_services_conflict svc,select_data_ptr *sdp,int fd,select_list_func func,
               void *arg1,void *arg2)

{
  undefined8 *puVar1;
  long lVar2;
  int iVar3;
  FunctionListElement *pFVar4;
  FunctionListElement *pFVar5;
  int *piVar6;
  long lVar7;
  select_data_ptr psVar8;
  size_t sVar9;
  long lVar10;
  epoll_event ep_event;
  epoll_event local_50;
  void *local_40;
  void *local_38;
  
  psVar8 = *sdp;
  local_40 = arg1;
  local_38 = arg2;
  if (psVar8 == (select_data_ptr)0x0) {
    init_select_data(svc,sdp,(CManager)0x0);
    psVar8 = *sdp;
  }
  if (psVar8->cm != (CManager)0x0) {
    iVar3 = (*svc->return_CM_lock_status)
                      (psVar8->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                       ,0x217);
    if (iVar3 == 0) {
      printf("%s:%u: failed assertion `%s\'\n",
             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
             ,0x217,"CM_LOCKED(svc, sd->cm)");
      abort();
    }
  }
  local_50.data.fd = 0;
  local_50.events = 0;
  local_50._4_4_ = 0;
  psVar8->select_consistency_number = psVar8->select_consistency_number + 1;
  lVar10 = (long)fd;
  if (psVar8->sel_item_max < fd) {
    sVar9 = (size_t)(fd * 0x18 + 0x18);
    pFVar4 = (FunctionListElement *)(*svc->realloc_func)(psVar8->select_items,sVar9);
    psVar8->select_items = pFVar4;
    pFVar5 = (FunctionListElement *)(*svc->realloc_func)(psVar8->write_items,sVar9);
    psVar8->write_items = pFVar5;
    pFVar4 = psVar8->select_items;
    if ((pFVar4 == (FunctionListElement *)0x0) || (pFVar5 == (FunctionListElement *)0x0)) {
      libcmepoll_LTX_write_select_cold_4();
    }
    iVar3 = psVar8->sel_item_max;
    if (iVar3 < fd) {
      lVar7 = lVar10 - iVar3;
      lVar2 = (long)iVar3 * 0x18;
      do {
        puVar1 = (undefined8 *)((long)&pFVar5[1].func + lVar2);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&pFVar5[1].arg2 + lVar2) = 0;
        *(undefined8 *)((long)&pFVar4[1].arg2 + lVar2) = 0;
        puVar1 = (undefined8 *)((long)&pFVar4[1].func + lVar2);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar7 = lVar7 + -1;
        lVar2 = lVar2 + 0x18;
      } while (lVar7 != 0);
    }
    psVar8->sel_item_max = fd;
  }
  local_50._4_4_ = fd;
  if (func == (select_list_func)0x0) {
    if (psVar8->select_items[lVar10].func == (select_list_func)0x0) {
      iVar3 = epoll_ctl(psVar8->epfd,2,fd,&local_50);
      if (iVar3 < 0) {
        libcmepoll_LTX_write_select_cold_3();
      }
    }
    else {
      local_50.events = 1;
      iVar3 = epoll_ctl(psVar8->epfd,3,fd,&local_50);
      if (iVar3 < 0) {
        libcmepoll_LTX_write_select_cold_2();
      }
    }
  }
  else {
    local_50.events = 4;
    iVar3 = epoll_ctl(psVar8->epfd,1,fd,&local_50);
    if (iVar3 < 0) {
      piVar6 = __errno_location();
      if (*piVar6 == 0x11) {
        local_50.events = 5;
        iVar3 = epoll_ctl(psVar8->epfd,3,fd,&local_50);
        if (iVar3 < 0) {
          libcmepoll_LTX_write_select_cold_1();
        }
      }
      else {
        fprintf(_stderr,"Something bad in %s. %d\n","libcmepoll_LTX_write_select");
      }
    }
  }
  pFVar4 = psVar8->write_items;
  pFVar4[lVar10].func = func;
  pFVar4[lVar10].arg1 = local_40;
  pFVar4[lVar10].arg2 = local_38;
  wake_server_thread((select_data_ptr)(ulong)(uint)psVar8->wake_write_fd);
  return;
}

Assistant:

extern void
libcmepoll_LTX_write_select(CMtrans_services svc, select_data_ptr *sdp, int fd, select_list_func func, void *arg1, void *arg2)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);
    struct epoll_event ep_event;

    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }
    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    memset(&ep_event, 0, sizeof(ep_event));
    sd->select_consistency_number++;
    if (fd > sd->sel_item_max) {
	int i;
	int size = (fd+1)*sizeof(sd->select_items[0]);
	sd->select_items = 
	    (FunctionListElement *) svc->realloc_func(sd->select_items, size);
	sd->write_items = 
	    (FunctionListElement *) svc->realloc_func(sd->write_items, size);
	if ((sd->select_items == NULL) || (sd->write_items == NULL)) {
	    perror("Realloc failed\n");
	    exit(1);
	}

	for (i = sd->sel_item_max + 1; i <= fd; i++) {
	    sd->write_items[i].func = NULL;
	    sd->write_items[i].arg1 = NULL;
	    sd->write_items[i].arg2 = NULL;
	    sd->select_items[i].func = NULL;
	    sd->select_items[i].arg1 = NULL;
	    sd->select_items[i].arg2 = NULL;
	}
	sd->sel_item_max = fd;
    }
    ep_event.data.fd = fd;
    if(func != NULL) {
    	ep_event.events = EPOLLOUT;
    	if(epoll_ctl(sd->epfd, EPOLL_CTL_ADD, fd, &ep_event) < 0) {
    		if(errno == EEXIST) {
    		    /* This is fd is already armed for read */
    		    ep_event.events = EPOLLIN | EPOLLOUT;
    		    if (epoll_ctl(sd->epfd, EPOLL_CTL_MOD, fd, &ep_event) < 0) {
    		    	fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    		    }
    		} else {
    		    fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    		}
    	}
    } else if(sd->select_items[fd].func) {
    	/* This fd should stay armed for read */
    	ep_event.events = EPOLLIN;
    	if (epoll_ctl(sd->epfd, EPOLL_CTL_MOD, fd, &ep_event) < 0) {
    	    fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    	}
	} else {
    	if(epoll_ctl(sd->epfd, EPOLL_CTL_DEL, fd, &ep_event) < 0) {
    	    fprintf(stderr, "Something bad happened in %s. %d\n", __func__, errno);
    	}
    }

    sd->write_items[fd].func = func;
    sd->write_items[fd].arg1 = arg1;
    sd->write_items[fd].arg2 = arg2;
    wake_server_thread(sd);
}